

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O2

ostream * __thiscall
diy::DynamicPoint<float,_4UL>::operator<<(DynamicPoint<float,_4UL> *this,ostream *out)

{
  ostream *this_00;
  size_t i;
  ulong uVar1;
  
  std::ostream::operator<<
            (out,*(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin);
  for (uVar1 = 1;
      uVar1 < ((ulong)((long)(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).
                             m_end -
                      (long)(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).
                            m_begin) >> 2 & 0xffffffff); uVar1 = uVar1 + 1) {
    this_00 = std::operator<<((ostream *)out," ");
    std::ostream::operator<<
              (this_00,(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin
                       [uVar1]);
  }
  return out;
}

Assistant:

std::ostream&       operator<<(std::ostream& out) const     { out << (*this)[0]; for (size_t i = 1; i < dimension(); ++i) out << " " << (*this)[i]; return out; }